

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

void __thiscall QFormLayout::setRowVisible(QFormLayout *this,QLayout *layout,bool on)

{
  bool bVar1;
  long in_FS_OFFSET;
  ItemRole role;
  int row;
  char local_50 [24];
  char *local_38;
  ItemRole local_30;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QLayoutPrivate::checkLayout(*(QLayoutPrivate **)&(this->super_QLayout).field_0x8,layout);
  if (bVar1) {
    local_2c = -0x55555556;
    local_30 = 0xaaaaaaaa;
    getLayoutPosition(this,layout,&local_2c,&local_30);
    if (local_2c < 0) {
      local_50[0] = '\x02';
      local_50[1] = '\0';
      local_50[2] = '\0';
      local_50[3] = '\0';
      local_50[0x14] = '\0';
      local_50[0x15] = '\0';
      local_50[0x16] = '\0';
      local_50[0x17] = '\0';
      local_50[4] = '\0';
      local_50[5] = '\0';
      local_50[6] = '\0';
      local_50[7] = '\0';
      local_50[8] = '\0';
      local_50[9] = '\0';
      local_50[10] = '\0';
      local_50[0xb] = '\0';
      local_50[0xc] = '\0';
      local_50[0xd] = '\0';
      local_50[0xe] = '\0';
      local_50[0xf] = '\0';
      local_50[0x10] = '\0';
      local_50[0x11] = '\0';
      local_50[0x12] = '\0';
      local_50[0x13] = '\0';
      local_38 = "default";
      QMessageLogger::warning(local_50,"QFormLayout::setRowVisible: Invalid layout");
    }
    else {
      setRowVisible(this,local_2c,on);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFormLayout::setRowVisible(QLayout *layout, bool on)
{
    Q_D(QFormLayout);
    if (Q_UNLIKELY(!d->checkLayout(layout)))
        return;

    int row;
    ItemRole role;
    getLayoutPosition(layout, &row, &role);

    if (Q_UNLIKELY(row < 0)) {
        qWarning("QFormLayout::setRowVisible: Invalid layout");
        return;
    }

    setRowVisible(row, on);
}